

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

size_t __thiscall google::protobuf::internal::ExtensionSet::MessageSetByteSize(ExtensionSet *this)

{
  KeyValue *pKVar1;
  size_t sVar2;
  KeyValue *pKVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  KeyValue *pKVar7;
  bool bVar8;
  size_t total_size;
  size_t local_30;
  
  local_30 = 0;
  lVar4 = (long)(short)this->flat_size_;
  pKVar3 = (this->map_).flat;
  if (lVar4 < 0) {
    MessageSetByteSize();
  }
  else {
    lVar5 = lVar4 * 0x20;
    pKVar1 = pKVar3 + lVar4;
    pKVar7 = pKVar3;
    if (this->flat_size_ != 0) {
      uVar6 = 0;
      do {
        lVar5 = lVar5 + -0x20;
        Extension::PrefetchPtr(&pKVar7->second);
        pKVar7 = pKVar7 + 1;
        if (lVar5 == 0) break;
        bVar8 = uVar6 < 0xf;
        uVar6 = uVar6 + 1;
      } while (bVar8);
    }
    for (; pKVar7 != pKVar1; pKVar7 = pKVar7 + 1) {
      sVar2 = Extension::MessageSetItemByteSize(&pKVar3->second,pKVar3->first);
      local_30 = local_30 + sVar2;
      Extension::PrefetchPtr(&pKVar7->second);
      pKVar3 = pKVar3 + 1;
    }
    for (; pKVar3 != pKVar1; pKVar3 = pKVar3 + 1) {
      sVar2 = Extension::MessageSetItemByteSize(&pKVar3->second,pKVar3->first);
      local_30 = local_30 + sVar2;
    }
  }
  return local_30;
}

Assistant:

size_t ExtensionSet::MessageSetByteSize() const {
  size_t total_size = 0;
  ForEach(
      [&total_size](int number, const Extension& ext) {
        total_size += ext.MessageSetItemByteSize(number);
      },
      Prefetch{});
  return total_size;
}